

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::io::anon_unknown_0::PrinterTest_FormatInternalIndent_Test::TestBody
          (PrinterTest_FormatInternalIndent_Test *this)

{
  ZeroCopyOutputStream *output;
  char *message;
  long lVar1;
  Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> args;
  string_view format;
  allocator_type local_27d;
  key_equal local_27c;
  hasher local_27b;
  allocator<char> local_27a;
  allocator<char> local_279;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string local_258 [32];
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_238;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218 [3];
  Printer printer;
  
  output = PrinterTest::output(&this->super_PrinterTest);
  Printer::Printer(&printer,output,'$',(AnnotationCollector *)0x0);
  printer.indent_ = printer.indent_ + printer.options_.spaces_per_indent;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"arg1",&local_279);
  std::__cxx11::string::string<std::allocator<char>>(local_258,"arg2",&local_27a);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[4],_const_char_(&)[4],_true>
            (local_218,(char (*) [4])0xdd11ec,(char (*) [4])0xf00b40);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[4],_const_char_(&)[4],_true>
            (local_218 + 1,(char (*) [4])0xf00ab0,(char (*) [4])0xef9a03);
  message = anon_var_dwarf_651463 + 5;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[1],_true>
            (local_218 + 2,(char (*) [6])0xd52e45,(char (*) [1])(anon_var_dwarf_651463 + 5));
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::raw_hash_set<std::pair<std::__cxx11::string,std::__cxx11::string>const*>
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_238,local_218,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&printer,0,&local_27b,&local_27c,&local_27d);
  args.len_ = 2;
  args.ptr_ = &local_278;
  format._M_str = "$empty $\n\n$1$ $foo $$2$\n$baz$";
  format._M_len = 0x1d;
  Printer::
  FormatInternal<absl::lts_20250127::flat_hash_map<std::__cxx11::string,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
            (&printer,args,
             (flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_238,format);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set(&local_238);
  lVar1 = 0x80;
  do {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&local_218[0].first._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x40;
  } while (lVar1 != -0x40);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_278._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  Printer::Outdent(&printer);
  Printer::~Printer(&printer);
  if ((this->super_PrinterTest).stream_.
      super__Optional_base<google::protobuf::io::StringOutputStream,_false,_false>._M_payload.
      super__Optional_payload<google::protobuf::io::StringOutputStream,_true,_false,_false>.
      super__Optional_payload_base<google::protobuf::io::StringOutputStream>._M_engaged == true) {
    (this->super_PrinterTest).stream_.
    super__Optional_base<google::protobuf::io::StringOutputStream,_false,_false>._M_payload.
    super__Optional_payload<google::protobuf::io::StringOutputStream,_true,_false,_false>.
    super__Optional_payload_base<google::protobuf::io::StringOutputStream>._M_engaged = false;
  }
  local_218[0].first._M_string_length = (size_type)(this->super_PrinterTest).out_._M_dataplus._M_p;
  local_218[0].first._M_dataplus._M_p = (pointer)(this->super_PrinterTest).out_._M_string_length;
  testing::internal::CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,char[24]>
            ((internal *)&printer,"written()","\"\\n\\n  arg1 bar arg2\\n  bla\"",
             (basic_string_view<char,_std::char_traits<char>_> *)local_218,
             (char (*) [24])"\n\n  arg1 bar arg2\n  bla");
  if ((char)printer.sink_.stream_ == '\0') {
    testing::Message::Message((Message *)local_218);
    if (printer.sink_.buffer_ != (void *)0x0) {
      message = *printer.sink_.buffer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer_unittest.cc"
               ,0x1ea,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_278,(Message *)local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_278);
    if ((long *)local_218[0].first._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_218[0].first._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&printer.sink_.buffer_);
  return;
}

Assistant:

TEST_F(PrinterTest, FormatInternalIndent) {
  {
    Printer printer(output(), '$');
    printer.Indent();
    printer.FormatInternal({"arg1", "arg2"},
                           {{"foo", "bar"}, {"baz", "bla"}, {"empty", ""}},
                           "$empty $\n\n$1$ $foo $$2$\n$baz$");
    printer.Outdent();
  }
  EXPECT_EQ(written(), "\n\n  arg1 bar arg2\n  bla");
}